

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_aa93::MemoryMappedFileTest_DtorUnmapsFile_Test::TestBody
          (MemoryMappedFileTest_DtorUnmapsFile_Test *this)

{
  CStringRef path;
  StringRef data;
  bool bVar1;
  exception *gtest_exception;
  ReturnSentinel gtest_sentinel;
  scoped_ptr<testing::internal::DeathTest> gtest_dt_ptr;
  DeathTest *gtest_dt;
  RE *gtest_regex;
  MemoryMappedFile<fmt::File> f;
  File file;
  char *start;
  string filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  RE *in_stack_fffffffffffffe20;
  RE *in_stack_fffffffffffffe28;
  File *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3c;
  undefined1 in_stack_fffffffffffffe3d;
  byte in_stack_fffffffffffffe3e;
  undefined1 in_stack_fffffffffffffe3f;
  MemoryMappedFile<fmt::File> *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  Type in_stack_fffffffffffffe4c;
  int in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  undefined1 in_stack_fffffffffffffe80 [12];
  undefined4 in_stack_fffffffffffffe8c;
  int iVar2;
  CStringRef in_stack_fffffffffffffe90;
  Message *in_stack_fffffffffffffe98;
  AssertHelper *in_stack_fffffffffffffea0;
  ReturnSentinel local_148;
  scoped_ptr<testing::internal::DeathTest> local_140;
  MemoryMappedFile<fmt::File> *local_138;
  File *in_stack_fffffffffffffed0;
  MemoryMappedFileBase local_98 [2];
  char *local_78;
  string local_48 [32];
  string local_28 [40];
  
  (anonymous_namespace)::GetExecutableDir_abi_cxx11_();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20);
  std::__cxx11::string::~string(local_48);
  fmt::BasicCStringRef<char>::BasicCStringRef
            ((BasicCStringRef<char> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  fmt::BasicStringRef<char>::BasicStringRef
            ((BasicStringRef<char> *)in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18);
  data.size_._4_4_ = in_stack_fffffffffffffe8c;
  data._0_12_ = in_stack_fffffffffffffe80;
  WriteFile(in_stack_fffffffffffffe90,data);
  local_78 = (char *)0x0;
  fmt::BasicCStringRef<char>::BasicCStringRef
            ((BasicCStringRef<char> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  path.data_._4_4_ = in_stack_fffffffffffffe54;
  path.data_._0_4_ = in_stack_fffffffffffffe50;
  fmt::File::File((File *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),path,
                  (int)((ulong)in_stack_fffffffffffffe40 >> 0x20));
  fmt::File::size(in_stack_fffffffffffffed0);
  mp::MemoryMappedFile<fmt::File>::MemoryMappedFile
            (in_stack_fffffffffffffe40,
             (File *)CONCAT17(in_stack_fffffffffffffe3f,
                              CONCAT16(in_stack_fffffffffffffe3e,
                                       CONCAT15(in_stack_fffffffffffffe3d,
                                                CONCAT14(in_stack_fffffffffffffe3c,
                                                         in_stack_fffffffffffffe38)))),
             (size_t)in_stack_fffffffffffffe30);
  local_78 = mp::internal::MemoryMappedFileBase::start(local_98);
  mp::MemoryMappedFile<fmt::File>::~MemoryMappedFile((MemoryMappedFile<fmt::File> *)0x118685);
  fmt::File::~File(in_stack_fffffffffffffe30);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::RE::RE(in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18);
    bVar1 = testing::internal::DeathTest::Create
                      ((char *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                       (char *)in_stack_fffffffffffffe20,
                       (int)((ulong)in_stack_fffffffffffffe18 >> 0x20),(DeathTest **)0x1186f8);
    in_stack_fffffffffffffe54 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe54);
    if (bVar1) {
      if (local_138 != (MemoryMappedFile<fmt::File> *)0x0) {
        testing::internal::scoped_ptr<testing::internal::DeathTest>::scoped_ptr
                  (&local_140,(DeathTest *)local_138);
        in_stack_fffffffffffffe50 =
             (**(code **)((local_138->super_MemoryMappedFileBase).start_ + 0x10))();
        if (in_stack_fffffffffffffe50 == 0) {
          in_stack_fffffffffffffe4c =
               (**(code **)((local_138->super_MemoryMappedFileBase).start_ + 0x18))();
          in_stack_fffffffffffffe3f = testing::internal::ExitedUnsuccessfully(0);
          in_stack_fffffffffffffe3e =
               (**(code **)((local_138->super_MemoryMappedFileBase).start_ + 0x20))
                         (local_138,in_stack_fffffffffffffe3f);
          in_stack_fffffffffffffe40 = local_138;
          if ((in_stack_fffffffffffffe3e & 1) != 0) goto LAB_00118a47;
          iVar2 = 2;
        }
        else {
          if (in_stack_fffffffffffffe50 == 1) {
            testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                      (&local_148,(DeathTest *)local_138);
            in_stack_fffffffffffffe3d = testing::internal::AlwaysTrue();
            (**(code **)((local_138->super_MemoryMappedFileBase).start_ + 0x28))(local_138,2);
            testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                      ((ReturnSentinel *)0x1189b1);
          }
LAB_00118a47:
          iVar2 = 0;
        }
        testing::internal::scoped_ptr<testing::internal::DeathTest>::~scoped_ptr
                  ((scoped_ptr<testing::internal::DeathTest> *)0x118a5c);
        if (iVar2 != 0) goto LAB_00118a7f;
      }
      iVar2 = 0;
    }
    else {
      iVar2 = 2;
    }
LAB_00118a7f:
    testing::internal::RE::~RE(in_stack_fffffffffffffe20);
    if (iVar2 == 0) goto LAB_00118b50;
  }
  testing::Message::Message
            ((Message *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             in_stack_fffffffffffffe4c,(char *)in_stack_fffffffffffffe40,
             CONCAT13(in_stack_fffffffffffffe3f,
                      CONCAT12(in_stack_fffffffffffffe3e,
                               CONCAT11(in_stack_fffffffffffffe3d,in_stack_fffffffffffffe3c))),
             (char *)in_stack_fffffffffffffe30);
  testing::internal::AssertHelper::operator=(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe20);
  testing::Message::~Message((Message *)0x118b0e);
LAB_00118b50:
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

TEST(MemoryMappedFileTest, DtorUnmapsFile) {
  std::string filename = GetExecutableDir() + "/test";
  WriteFile(filename, "abc");
  const volatile char *start = 0;
  {
    File file(filename, File::RDONLY);
    MemoryMappedFile<> f(file, static_cast<std::size_t>(file.size()));
    start = f.start();
  }
  EXPECT_DEATH((void)*start, "");
}